

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O2

void __thiscall duckdb_shell::ModeJsonRenderer::RenderRow(ModeJsonRenderer *this,RowResult *result)

{
  pointer piVar1;
  int iVar2;
  pointer ppcVar3;
  char *z;
  ShellState *pSVar4;
  idx_t i;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    ppcVar3 = (result->column_names).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(result->column_names).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppcVar3 >> 3) <= uVar5) {
      ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,"}");
      return;
    }
    if (uVar5 != 0) {
      ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,",");
      ppcVar3 = (result->column_names).
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    }
    iVar2 = -1;
    ShellState::OutputJSONString
              ((this->super_RowRenderer).super_ShellRenderer.state,ppcVar3[uVar5],-1);
    ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,":");
    z = (result->data).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5];
    if (z == (char *)0x0) {
switchD_001eb669_caseD_5:
      pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
LAB_001eb6c9:
      z = "null";
LAB_001eb714:
      ShellState::Print(pSVar4,z);
    }
    else {
      piVar1 = (result->types).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar1 == (result->types).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
switchD_001eb669_default:
        pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
        goto LAB_001eb714;
      }
      switch(piVar1[uVar5]) {
      case 2:
        iVar2 = strcmp(z,"inf");
        if (iVar2 == 0) {
          pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
          z = "1e999";
        }
        else {
          iVar2 = strcmp(z,"-inf");
          if (iVar2 != 0) {
            iVar2 = strcmp(z,"nan");
            if (iVar2 == 0) goto switchD_001eb669_caseD_5;
            iVar2 = strcmp(z,"-nan");
            pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
            if (iVar2 != 0) goto LAB_001eb714;
            goto LAB_001eb6c9;
          }
          pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
          z = "-1e999";
        }
        goto LAB_001eb714;
      case 3:
        pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
        break;
      case 4:
        if (result->pStmt == (sqlite3_stmt *)0x0) goto switchD_001eb669_default;
        z = (char *)duckdb_shell_sqlite3_column_blob(result->pStmt,(int)uVar5);
        iVar2 = duckdb_shell_sqlite3_column_bytes(result->pStmt,(int)uVar5);
        pSVar4 = (this->super_RowRenderer).super_ShellRenderer.state;
        break;
      case 5:
        goto switchD_001eb669_caseD_5;
      default:
        goto switchD_001eb669_default;
      }
      ShellState::OutputJSONString(pSVar4,z,iVar2);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void RenderRow(RowResult &result) override {
		auto &data = result.data;
		auto &types = result.types;
		auto &col_names = result.column_names;
		for (idx_t i = 0; i < col_names.size(); i++) {
			if (i > 0) {
				state.Print(",");
			}
			state.OutputJSONString(col_names[i], -1);
			state.Print(":");
			if ((data[i] == 0) || (!types.empty() && types[i] == SQLITE_NULL)) {
				state.Print("null");
			} else if (!types.empty() && types[i] == SQLITE_FLOAT) {
				if (strcmp(data[i], "inf") == 0) {
					state.Print("1e999");
				} else if (strcmp(data[i], "-inf") == 0) {
					state.Print("-1e999");
				} else if (strcmp(data[i], "nan") == 0) {
					state.Print("null");
				} else if (strcmp(data[i], "-nan") == 0) {
					state.Print("null");
				} else {
					state.Print(data[i]);
				}
			} else if (!types.empty() && types[i] == SQLITE_BLOB && result.pStmt) {
				const void *pBlob = sqlite3_column_blob(result.pStmt, i);
				int nBlob = sqlite3_column_bytes(result.pStmt, i);
				state.OutputJSONString((const char *)pBlob, nBlob);
			} else if (!types.empty() && types[i] == SQLITE_TEXT) {
				state.OutputJSONString(data[i], -1);
			} else {
				state.Print(data[i]);
			}
		}
		state.Print("}");
	}